

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_paddusb_mips64(uint64_t fs,uint64_t ft)

{
  uint local_34;
  uint local_2c;
  int r;
  uint i;
  LMIValue vt;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.d = fs;
  _r = ft;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    local_34 = (uint)vt.ub[local_2c] + (uint)*(byte *)((long)&r + (ulong)local_2c);
    if (0xff < local_34) {
      local_34 = 0xff;
    }
    vt.ub[local_2c] = (uint8_t)local_34;
  }
  return vt.d;
}

Assistant:

uint64_t helper_paddusb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        int r = vs.ub[i] + vt.ub[i];
        vs.ub[i] = SATUB(r);
    }
    return vs.d;
}